

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* get_header_values(span<cinatra::http_header,_18446744073709551615UL> *resp_headers,string_view key
                   )

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  reference phVar2;
  char *in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  span<cinatra::http_header,_18446744073709551615UL> *in_RDI;
  http_header *p;
  iterator __end1;
  iterator __begin1;
  span<cinatra::http_header,_18446744073709551615UL> *__range1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *values;
  span<cinatra::http_header,_18446744073709551615UL> *__lhs;
  value_type *in_stack_ffffffffffffff88;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
  local_38;
  undefined8 local_30;
  undefined1 local_21;
  undefined8 local_20;
  size_t local_18;
  char *local_10;
  
  local_21 = 0;
  __lhs = in_RDI;
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  memset(in_RDI,0,0x18);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x4bf1e5);
  local_30 = local_20;
  local_38._M_current =
       (http_header *)std::span<cinatra::http_header,_18446744073709551615UL>::begin(in_RDI);
  std::span<cinatra::http_header,_18446744073709551615UL>::end
            ((span<cinatra::http_header,_18446744073709551615UL> *)in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::
                 operator==<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                           ((__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                             *)__lhs,(__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                                      *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    phVar2 = __gnu_cxx::
             __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
             ::operator*(&local_38);
    __x._M_len = (phVar2->name)._M_len;
    __x._M_str = (phVar2->name)._M_str;
    __y._M_str = local_10;
    __y._M_len = local_18;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    __gnu_cxx::
    __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string_view> get_header_values(
    std::span<http_header> &resp_headers, std::string_view key) {
  std::vector<std::string_view> values{};
  for (const auto &p : resp_headers) {
    if (p.name == key)
      values.push_back(p.value);
  }
  return values;
}